

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O3

void __thiscall dg::DGLLVMPointsToSet::_findNextReal(DGLLVMPointsToSet *this)

{
  size_t *psVar1;
  long lVar2;
  size_t sVar3;
  __node_type *p_Var4;
  
  p_Var4 = (this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).it.
           container_it.container_it.
           super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur;
  sVar3 = (this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).it.
          container_it.pos;
  if (sVar3 != 0 || p_Var4 != (__node_type *)0x0) {
    do {
      lVar2 = *(long *)(*(long *)&(p_Var4->
                                  super__Hash_node_value<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_unsigned_long,_unsigned_long>_>
                                  ._M_storage._M_storage * 0x10 + -0x10 +
                       sVar3 * 0x10 + ___throw_logic_error);
      if (((lVar2 != pta::NULLPTR) && (lVar2 != pta::UNKNOWN_MEMORY)) && (lVar2 != pta::INVALIDATED)
         ) {
        return;
      }
      ADT::
      SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      ::const_iterator::operator++
                (&(this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).
                  it.container_it);
      psVar1 = &(this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).
                _position;
      *psVar1 = *psVar1 + 1;
      p_Var4 = (this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).it.
               container_it.container_it.
               super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
               _M_cur;
      sVar3 = (this->super_LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>).it.
              container_it.pos;
    } while (p_Var4 != (__node_type *)0x0 || sVar3 != 0);
  }
  return;
}

Assistant:

bool operator==(const const_iterator &rhs) const {
            return pos == rhs.pos && container_it == rhs.container_it;
        }